

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O2

MPP_RET hal_h264e_vepu541_ret_task(void *hal,HalEncTask *task)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  EncRcTask *pEVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  uVar8 = *(int *)(*(long *)((long)hal + 0x38) + 0x40) *
          *(int *)(*(long *)((long)hal + 0x38) + 0x3c);
  pEVar4 = task->rc_task;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_ret_task",hal);
  }
  task->length = task->length + task->hw_length;
  iVar10 = task->hw_length << 3;
  (pEVar4->info).bit_real = iVar10;
  uVar9 = 0;
  uVar6 = (*(uint *)((long)hal + 0x818) & 0x3fffff) / uVar8;
  (pEVar4->info).quality_real = uVar6;
  uVar7 = 0;
  if (*(uint *)((long)hal + 0x940) != 0) {
    uVar7 = *(uint *)((long)hal + 0x93c) / *(uint *)((long)hal + 0x940);
  }
  (pEVar4->info).madi = uVar7;
  if (*(uint *)((long)hal + 0x938) != 0) {
    uVar9 = *(uint *)((long)hal + 0x934) / *(uint *)((long)hal + 0x938);
  }
  (pEVar4->info).madp = uVar9;
  RVar1 = *(RK_U32 *)((long)hal + 0x860);
  RVar2 = *(RK_U32 *)((long)hal + 0x858);
  RVar3 = *(RK_U32 *)((long)hal + 0x85c);
  uVar8 = ((RVar3 + RVar1 + RVar2) * 0x100) / uVar8;
  (pEVar4->info).iblk4_prop = uVar8;
  (pEVar4->info).sse =
       (ulong)CONCAT14(*(undefined1 *)((long)hal + 0x81b),*(undefined4 *)((long)hal + 0x814));
  uVar5 = *(undefined8 *)((long)hal + 0x84c);
  (pEVar4->info).lvl16_inter_num = (int)uVar5;
  (pEVar4->info).lvl8_inter_num = (int)((ulong)uVar5 >> 0x20);
  (pEVar4->info).lvl16_intra_num = RVar2;
  (pEVar4->info).lvl8_intra_num = RVar3;
  (pEVar4->info).lvl4_intra_num = RVar1;
  *(int *)((long)hal + 0xf0) = iVar10;
  *(uint *)((long)hal + 0xf4) = uVar6;
  *(uint *)((long)hal + 0x100) = uVar8;
  (task->hal_ret).data = (void *)((long)hal + 0xd0);
  (task->hal_ret).number = 1;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu541_ret_task(void *hal, HalEncTask *task)
{
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;

    hal_h264e_dbg_func("enter %p\n", hal);

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = ctx->regs_ret.st_sse_qp.qp_sum / mbs;
    rc_info->madi = (!ctx->regs_ret.st_mb_num) ? 0 :
                    ctx->regs_ret.st_madi /  ctx->regs_ret.st_mb_num;
    rc_info->madp = (!ctx->regs_ret.st_ctu_num) ? 0 :
                    ctx->regs_ret.st_madp / ctx->regs_ret.st_ctu_num;
    rc_info->iblk4_prop = (ctx->regs_ret.st_lvl4_intra_num +
                           ctx->regs_ret.st_lvl8_intra_num +
                           ctx->regs_ret.st_lvl16_intra_num) * 256 / mbs;

    rc_info->sse = ((RK_S64)(ctx->regs_ret.st_sse_qp.sse_h8 & 0xff) << 32) +
                   ctx->regs_ret.st_sse_l32.sse_l32;
    rc_info->lvl16_inter_num = ctx->regs_ret.st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = ctx->regs_ret.st_lvl8_inter_num;
    rc_info->lvl16_intra_num = ctx->regs_ret.st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = ctx->regs_ret.st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = ctx->regs_ret.st_lvl4_intra_num;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}